

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

RTFLOAT __thiscall RTMatrix4x4::matDet(RTMatrix4x4 *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  RTFLOAT RVar5;
  RTFLOAT RVar6;
  RTFLOAT RVar7;
  RTFLOAT RVar8;
  
  fVar1 = this->m_data[0][0];
  RVar5 = matMinor(this,0,0);
  fVar2 = this->m_data[0][1];
  RVar6 = matMinor(this,0,1);
  fVar3 = this->m_data[0][2];
  RVar7 = matMinor(this,0,2);
  fVar4 = this->m_data[0][3];
  RVar8 = matMinor(this,0,3);
  return (RVar7 * fVar3 + ((RVar5 * fVar1 + 0.0) - RVar6 * fVar2)) - RVar8 * fVar4;
}

Assistant:

RTFLOAT RTMatrix4x4::matDet()
{
    RTFLOAT det = 0;

    det += m_data[0][0] * matMinor(0, 0);
    det -= m_data[0][1] * matMinor(0, 1);
    det += m_data[0][2] * matMinor(0, 2);
    det -= m_data[0][3] * matMinor(0, 3);
    return det;
}